

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::left_rotate(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
              *this,Node *x)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = x->left;
  pNVar2 = x->parent;
  if (pNVar1 != this->nil) {
    pNVar1->parent = pNVar2;
  }
  pNVar2->right = pNVar1;
  pNVar1 = pNVar2->parent;
  (&pNVar1->left)[pNVar1->left != pNVar2] = x;
  x->parent = pNVar1;
  pNVar2->parent = x;
  x->left = pNVar2;
  return;
}

Assistant:

void left_rotate(Node *x)
	{
		Node *y = x -> parent;
		if (x -> left != nil) x -> left -> parent = y;
		y -> right = x -> left;
		if (y -> parent -> left == y) y -> parent -> left = x;
		else y -> parent -> right = x;
		x -> parent = y -> parent , y -> parent = x , x -> left = y;
	}